

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

void Cmd_RunAutoTuner(char *pConfig,char *pFileList,int nCores)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Wec_t *vPars_00;
  Vec_Ptr_t *vAigs_00;
  satoko_opts_t *pOpts_00;
  satoko_opts_t *psVar4;
  abctime aVar5;
  abctime aVar6;
  Gia_Man_t *p;
  Vec_Ptr_t *local_88;
  abctime clk_1;
  Gia_Man_t *pGia;
  int ResultBest;
  int Result;
  satoko_opts_t *pOptsBest;
  satoko_opts_t *pOpts;
  char *pStringBest;
  char *pString;
  int i;
  Vec_Ptr_t *vOpts;
  Vec_Ptr_t *vAigs;
  Vec_Wec_t *vPars;
  abctime clk;
  int nCores_local;
  char *pFileList_local;
  char *pConfig_local;
  
  aVar3 = Abc_Clock();
  vPars_00 = Cmd_ReadParamChoices(pConfig);
  vAigs_00 = Cmd_ReadFiles(pFileList);
  if (vPars_00 == (Vec_Wec_t *)0x0) {
    local_88 = (Vec_Ptr_t *)0x0;
  }
  else {
    local_88 = Cmf_CreateOptions(vPars_00);
  }
  pOpts = (satoko_opts_t *)0x0;
  pGia._0_4_ = 0x7fffffff;
  if ((vAigs_00 != (Vec_Ptr_t *)0x0) && (local_88 != (Vec_Ptr_t *)0x0)) {
    for (pString._4_4_ = 0; iVar1 = Vec_PtrSize(local_88), pString._4_4_ + 1 < iVar1;
        pString._4_4_ = pString._4_4_ + 2) {
      pOpts_00 = (satoko_opts_t *)Vec_PtrEntry(local_88,pString._4_4_);
      psVar4 = (satoko_opts_t *)Vec_PtrEntry(local_88,pString._4_4_ + 1);
      aVar6 = Abc_Clock();
      printf("Evaluating settings: %20s...  \n",psVar4);
      uVar2 = Cmd_RunAutoTunerEval(vAigs_00,pOpts_00,nCores);
      printf("Cost = %6d.  ",(ulong)uVar2);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar6);
      if ((int)uVar2 < (int)(uint)pGia) {
        pGia._0_4_ = uVar2;
        pOpts = psVar4;
      }
    }
    printf("The best settings are: %20s    \n",pOpts);
    printf("Best cost = %6d.  ",(ulong)(uint)pGia);
    aVar6 = Abc_Clock();
    Abc_PrintTime(1,"Total time",aVar6 - aVar3);
  }
  if (vPars_00 != (Vec_Wec_t *)0x0) {
    Vec_WecFree(vPars_00);
  }
  if (local_88 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(local_88);
  }
  if (vAigs_00 != (Vec_Ptr_t *)0x0) {
    for (pString._4_4_ = 0; iVar1 = Vec_PtrSize(vAigs_00), pString._4_4_ < iVar1;
        pString._4_4_ = pString._4_4_ + 1) {
      p = (Gia_Man_t *)Vec_PtrEntry(vAigs_00,pString._4_4_);
      Gia_ManStop(p);
    }
    Vec_PtrFree(vAigs_00);
  }
  return;
}

Assistant:

void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vPars = Cmd_ReadParamChoices( pConfig );
    Vec_Ptr_t * vAigs = Cmd_ReadFiles( pFileList );
    Vec_Ptr_t * vOpts = vPars ? Cmf_CreateOptions( vPars ) : NULL;
    int i; char * pString, * pStringBest = NULL;
    satoko_opts_t * pOpts, * pOptsBest = NULL;
    int Result, ResultBest = 0x7FFFFFFF;
    Gia_Man_t * pGia; 
    // iterate through all possible option settings
    if ( vAigs && vOpts )
    {
        Vec_PtrForEachEntryDouble( satoko_opts_t *, char *, vOpts, pOpts, pString, i )
        {
            abctime clk = Abc_Clock();
            printf( "Evaluating settings: %20s...  \n", pString );
            Result = Cmd_RunAutoTunerEval( vAigs, pOpts, nCores );
            printf( "Cost = %6d.  ", Result );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( ResultBest > Result )
            {
                ResultBest = Result;
                pStringBest = pString;
                pOptsBest = pOpts;
            }
        }
        printf( "The best settings are: %20s    \n", pStringBest );
        printf( "Best cost = %6d.  ", ResultBest );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    // cleanup
    if ( vPars ) Vec_WecFree( vPars );
    if ( vOpts ) Vec_PtrFreeFree( vOpts );
    if ( vAigs )
    {
        Vec_PtrForEachEntry( Gia_Man_t *, vAigs, pGia, i )
            Gia_ManStop( pGia );
        Vec_PtrFree( vAigs );
    }
}